

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void kj::resetCrashHandlers(void)

{
  int iVar1;
  void *pvVar2;
  Fault local_150;
  Fault f_6;
  SyscallResult local_13c;
  SyscallResult _kjSyscallResult_6;
  Fault f_5;
  SyscallResult local_124;
  SyscallResult _kjSyscallResult_5;
  Fault f_4;
  SyscallResult local_10c;
  SyscallResult _kjSyscallResult_4;
  Fault f_3;
  SyscallResult local_f4;
  SyscallResult _kjSyscallResult_3;
  Fault f_2;
  SyscallResult local_dc;
  SyscallResult _kjSyscallResult_2;
  Fault f_1;
  SyscallResult local_c8 [2];
  SyscallResult _kjSyscallResult_1;
  Fault local_b8;
  Fault f;
  SyscallResult local_a4;
  undefined1 auStack_a0 [4];
  SyscallResult _kjSyscallResult;
  sigaction action;
  
  memset(auStack_a0,0,0x98);
  _auStack_a0 = (char *)0x0;
  f.exception = (Exception *)auStack_a0;
  local_a4 = _::Debug::syscall<kj::resetCrashHandlers()::__0>((anon_class_8_1_4c536f74 *)&f,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_a4);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_a4);
    _::Debug::Fault::Fault
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
               ,0x372,iVar1,"sigaction(SIGSEGV, &action, nullptr)","");
    _::Debug::Fault::fatal(&local_b8);
  }
  f_1.exception = (Exception *)auStack_a0;
  local_c8[0] = _::Debug::syscall<kj::resetCrashHandlers()::__1>
                          ((anon_class_8_1_4c536f74 *)&f_1,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(local_c8);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(local_c8);
    _::Debug::Fault::Fault
              ((Fault *)&stack0xffffffffffffff28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
               ,0x373,iVar1,"sigaction(SIGBUS, &action, nullptr)","");
    _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff28);
  }
  f_2.exception = (Exception *)auStack_a0;
  local_dc = _::Debug::syscall<kj::resetCrashHandlers()::__2>((anon_class_8_1_4c536f74 *)&f_2,false)
  ;
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_dc);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_dc);
    _::Debug::Fault::Fault
              ((Fault *)&stack0xffffffffffffff10,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
               ,0x374,iVar1,"sigaction(SIGFPE, &action, nullptr)","");
    _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff10);
  }
  f_3.exception = (Exception *)auStack_a0;
  local_f4 = _::Debug::syscall<kj::resetCrashHandlers()::__3>((anon_class_8_1_4c536f74 *)&f_3,false)
  ;
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_f4);
  if (pvVar2 != (void *)0x0) {
    f_4.exception = (Exception *)auStack_a0;
    local_10c = _::Debug::syscall<kj::resetCrashHandlers()::__4>
                          ((anon_class_8_1_4c536f74 *)&f_4,false);
    pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_10c);
    if (pvVar2 == (void *)0x0) {
      iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_10c);
      _::Debug::Fault::Fault
                ((Fault *)&stack0xfffffffffffffee0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
                 ,0x376,iVar1,"sigaction(SIGILL, &action, nullptr)","");
      _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffee0);
    }
    f_5.exception = (Exception *)auStack_a0;
    local_124 = _::Debug::syscall<kj::resetCrashHandlers()::__5>
                          ((anon_class_8_1_4c536f74 *)&f_5,false);
    pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_124);
    if (pvVar2 != (void *)0x0) {
      f_6.exception = (Exception *)auStack_a0;
      local_13c = _::Debug::syscall<kj::resetCrashHandlers()::__6>
                            ((anon_class_8_1_4c536f74 *)&f_6,false);
      pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_13c);
      if (pvVar2 != (void *)0x0) {
        std::set_terminate((_func_void *)0x0);
        return;
      }
      iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_13c);
      _::Debug::Fault::Fault
                (&local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
                 ,0x37a,iVar1,"sigaction(SIGINT, &action, nullptr)","");
      _::Debug::Fault::fatal(&local_150);
    }
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_124);
    _::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffec8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
               ,0x377,iVar1,"sigaction(SIGSYS, &action, nullptr)","");
    _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffec8);
  }
  iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_f4);
  _::Debug::Fault::Fault
            ((Fault *)&stack0xfffffffffffffef8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
             ,0x375,iVar1,"sigaction(SIGABRT, &action, nullptr)","");
  _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffef8);
}

Assistant:

void resetCrashHandlers() {
#ifndef _WIN32
  struct sigaction action;
  memset(&action, 0, sizeof(action));

  action.sa_handler = SIG_DFL;
  KJ_SYSCALL(sigaction(SIGSEGV, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGBUS, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGFPE, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGABRT, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGILL, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGSYS, &action, nullptr));

#ifdef KJ_DEBUG
  KJ_SYSCALL(sigaction(SIGINT, &action, nullptr));
#endif
#endif

  std::set_terminate(nullptr);
}